

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  Edge *graph_00;
  time_t tVar2;
  undefined1 local_6c [8];
  Solution returns;
  int state;
  int amountVertices;
  Edge *graph;
  char **argv_local;
  int argc_local;
  
  name = *argv;
  graph_00 = (Edge *)malloc((long)(argc + -1) << 3);
  load_buffer();
  if (argc == 1) {
    clean_loaded_buffer();
    fprintf(_stderr,"%s ERROR: graph has to have at least one edge\n",name);
    exit(1);
  }
  iVar1 = increment_state();
  if (iVar1 == 0) {
    tVar2 = time((time_t *)0x0);
    iVar1 = get_state();
    srand((int)tVar2 + iVar1 * 1000);
    read_input(argc,argv,graph_00);
    returns.amount = get_max_node(graph_00,argc + -1);
    do {
      returns.edges[7].end = get_state();
      if (returns.edges[7].end < 1) {
        free(graph_00);
        sem_post((sem_t *)free_sem);
        clean_loaded_buffer();
        exit(0);
      }
      calculate_one_solution((Solution *)local_6c,argc + -1,graph_00,returns.amount);
    } while ((7 < returns.edges[7].start) ||
            (iVar1 = circ_buf_write((Solution *)local_6c), iVar1 == 0));
    fprintf(_stderr,"%s ERROR: error writing to shared memory\n",name);
    exit(1);
  }
  fprintf(_stderr,"%s ERROR: couldn\'t increment system state\n",name);
  exit(1);
}

Assistant:

int main(int argc, const char **argv)
{
    name = argv[0];
    Edge *graph = malloc(sizeof(Edge) * (argc - 1));

    load_buffer();

    if (1 == argc)
    {
        clean_loaded_buffer();
        ERROR_EXIT("graph has to have at least one edge");
    }

    if (increment_state() != 0)
    {
        ERROR_EXIT("couldn't increment system state");
    }
    srand(time(0) + get_state() * 1000);

    read_input(argc, argv, graph);

    int amountVertices = get_max_node(graph, argc-1);

    int state;
    while ((state = get_state()) > 0)
    {
        Solution returns = calculate_one_solution(argc-1, graph, amountVertices);

        if (returns.amount < MAXRETURN)
        {
#ifdef DEBUG
            printEdge(returns.edges, returns.amount);
#endif
            if (circ_buf_write(&returns) != 0)
            {
                ERROR_EXIT("error writing to shared memory");
            }
        }
        else
        {
#ifdef DEBUG
            fprintf(stdout, "Solution too Big");
#endif
        }
    }

    free(graph);
    sem_post(free_sem);

    clean_loaded_buffer();
    exit(EXIT_SUCCESS);
}